

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  int iVar4;
  undefined4 uVar5;
  float fVar6;
  undefined4 uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  byte bVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  NodeRef *pNVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  ulong uVar27;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 local_14e8 [16];
  ulong local_14d8;
  long local_14d0;
  Scene *local_14c8;
  long local_14c0;
  undefined1 local_14b8 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [32];
  undefined1 local_13a8 [32];
  undefined1 local_1388 [32];
  undefined1 local_1368 [32];
  undefined1 local_1348 [32];
  undefined1 local_1328 [32];
  RTCHitN local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  uint local_1298;
  uint uStack_1294;
  uint uStack_1290;
  uint uStack_128c;
  uint uStack_1288;
  uint uStack_1284;
  uint uStack_1280;
  uint uStack_127c;
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  NodeRef stack [564];
  float fVar2;
  float fVar3;
  
  pNVar21 = stack + 1;
  stack[0] = root;
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar62 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar63 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar64 = ZEXT3264(auVar51);
  local_11f8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1218 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1238 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(local_11f8 * 0.99999964)));
  auVar65 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1218 * 0.99999964)));
  auVar66 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1238 * 0.99999964)));
  auVar67 = ZEXT3264(auVar51);
  local_11f8 = local_11f8 * 1.0000004;
  local_1218 = local_1218 * 1.0000004;
  local_1238 = local_1238 * 1.0000004;
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar4 = (tray->tnear).field_0.i[k];
  auVar59 = ZEXT3264(CONCAT428(iVar4,CONCAT424(iVar4,CONCAT420(iVar4,CONCAT416(iVar4,CONCAT412(iVar4
                                                  ,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))))))));
  iVar4 = (tray->tfar).field_0.i[k];
  auVar60 = ZEXT3264(CONCAT428(iVar4,CONCAT424(iVar4,CONCAT420(iVar4,CONCAT416(iVar4,CONCAT412(iVar4
                                                  ,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))))))));
  auVar14 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar26 = true;
  fStack_11f4 = local_11f8;
  fStack_11f0 = local_11f8;
  fStack_11ec = local_11f8;
  fStack_11e8 = local_11f8;
  fStack_11e4 = local_11f8;
  fStack_11e0 = local_11f8;
  fStack_11dc = local_11f8;
  fStack_1214 = local_1218;
  fStack_1210 = local_1218;
  fStack_120c = local_1218;
  fStack_1208 = local_1218;
  fStack_1204 = local_1218;
  fStack_1200 = local_1218;
  fStack_11fc = local_1218;
  fStack_1234 = local_1238;
  fStack_1230 = local_1238;
  fStack_122c = local_1238;
  fStack_1228 = local_1238;
  fStack_1224 = local_1238;
  fStack_1220 = local_1238;
  fStack_121c = local_1238;
  do {
    sVar23 = pNVar21[-1].ptr;
    pNVar21 = pNVar21 + -1;
    while( true ) {
      if ((sVar23 & 8) != 0) break;
      uVar16 = sVar23 & 0xfffffffffffffff0;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar56._4_4_ = uVar5;
      auVar56._0_4_ = uVar5;
      auVar56._8_4_ = uVar5;
      auVar56._12_4_ = uVar5;
      auVar56._16_4_ = uVar5;
      auVar56._20_4_ = uVar5;
      auVar56._24_4_ = uVar5;
      auVar56._28_4_ = uVar5;
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar22),auVar56,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar22));
      auVar51 = vsubps_avx512vl(ZEXT1632(auVar50),auVar62._0_32_);
      auVar51 = vmulps_avx512vl(auVar65._0_32_,auVar51);
      auVar51 = vmaxps_avx(auVar59._0_32_,auVar51);
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar18),auVar56,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar18));
      auVar52 = vsubps_avx512vl(ZEXT1632(auVar50),auVar63._0_32_);
      auVar52 = vmulps_avx512vl(auVar66._0_32_,auVar52);
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar24),auVar56,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar24));
      auVar53 = vsubps_avx512vl(ZEXT1632(auVar50),auVar64._0_32_);
      auVar53 = vmulps_avx512vl(auVar67._0_32_,auVar53);
      auVar52 = vmaxps_avx(auVar52,auVar53);
      auVar51 = vmaxps_avx(auVar51,auVar52);
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar22 ^ 0x20)),auVar56,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar22 ^ 0x20)));
      auVar53 = vsubps_avx512vl(ZEXT1632(auVar50),auVar62._0_32_);
      auVar52._4_4_ = fStack_11f4 * auVar53._4_4_;
      auVar52._0_4_ = local_11f8 * auVar53._0_4_;
      auVar52._8_4_ = fStack_11f0 * auVar53._8_4_;
      auVar52._12_4_ = fStack_11ec * auVar53._12_4_;
      auVar52._16_4_ = fStack_11e8 * auVar53._16_4_;
      auVar52._20_4_ = fStack_11e4 * auVar53._20_4_;
      auVar52._24_4_ = fStack_11e0 * auVar53._24_4_;
      auVar52._28_4_ = auVar53._28_4_;
      auVar52 = vminps_avx(auVar60._0_32_,auVar52);
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar18 ^ 0x20)),auVar56,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar18 ^ 0x20)));
      auVar54 = vsubps_avx512vl(ZEXT1632(auVar50),auVar63._0_32_);
      auVar53._4_4_ = fStack_1214 * auVar54._4_4_;
      auVar53._0_4_ = local_1218 * auVar54._0_4_;
      auVar53._8_4_ = fStack_1210 * auVar54._8_4_;
      auVar53._12_4_ = fStack_120c * auVar54._12_4_;
      auVar53._16_4_ = fStack_1208 * auVar54._16_4_;
      auVar53._20_4_ = fStack_1204 * auVar54._20_4_;
      auVar53._24_4_ = fStack_1200 * auVar54._24_4_;
      auVar53._28_4_ = auVar54._28_4_;
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar24 ^ 0x20)),auVar56,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar24 ^ 0x20)));
      auVar55 = vsubps_avx512vl(ZEXT1632(auVar50),auVar64._0_32_);
      auVar54._4_4_ = fStack_1234 * auVar55._4_4_;
      auVar54._0_4_ = local_1238 * auVar55._0_4_;
      auVar54._8_4_ = fStack_1230 * auVar55._8_4_;
      auVar54._12_4_ = fStack_122c * auVar55._12_4_;
      auVar54._16_4_ = fStack_1228 * auVar55._16_4_;
      auVar54._20_4_ = fStack_1224 * auVar55._20_4_;
      auVar54._24_4_ = fStack_1220 * auVar55._24_4_;
      auVar54._28_4_ = auVar55._28_4_;
      auVar53 = vminps_avx(auVar53,auVar54);
      auVar52 = vminps_avx(auVar52,auVar53);
      if (((uint)sVar23 & 7) == 6) {
        uVar11 = vcmpps_avx512vl(auVar51,auVar52,2);
        uVar12 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar16 + 0x1c0),0xd);
        uVar13 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar16 + 0x1e0),1);
        uVar20 = (uint)uVar11 & (uint)uVar12 & (uint)uVar13;
      }
      else {
        uVar11 = vcmpps_avx512vl(auVar51,auVar52,2);
        uVar20 = (uint)uVar11;
      }
      if ((byte)uVar20 == 0) goto LAB_00790d50;
      lVar17 = 0;
      for (uVar19 = (ulong)(byte)uVar20; (uVar19 & 1) == 0;
          uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      sVar23 = *(size_t *)(uVar16 + lVar17 * 8);
      uVar20 = (uVar20 & 0xff) - 1 & uVar20 & 0xff;
      uVar19 = (ulong)uVar20;
      if (uVar20 != 0) {
        pNVar21->ptr = sVar23;
        lVar17 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          lVar17 = lVar17 + 1;
        }
        uVar20 = uVar20 - 1 & uVar20;
        uVar19 = (ulong)uVar20;
        bVar25 = uVar20 == 0;
        while( true ) {
          pNVar21 = pNVar21 + 1;
          sVar23 = *(size_t *)(uVar16 + lVar17 * 8);
          if (bVar25) break;
          pNVar21->ptr = sVar23;
          lVar17 = 0;
          for (uVar27 = uVar19; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar19 = uVar19 - 1 & uVar19;
          bVar25 = uVar19 == 0;
        }
      }
    }
    local_14c0 = (ulong)((uint)sVar23 & 0xf) - 8;
    if (local_14c0 != 0) {
      uVar16 = sVar23 & 0xfffffffffffffff0;
      local_14d0 = 0;
      local_1258 = auVar59._0_32_;
      local_1278 = auVar60._0_32_;
      do {
        lVar17 = local_14d0 * 0x140;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar37._4_4_ = uVar5;
        auVar37._0_4_ = uVar5;
        auVar37._8_4_ = uVar5;
        auVar37._12_4_ = uVar5;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x90 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + lVar17));
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xa0 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + 0x10 + lVar17));
        auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xb0 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + 0x20 + lVar17));
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xc0 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + 0x30 + lVar17));
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xd0 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + 0x40 + lVar17));
        auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xe0 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + 0x50 + lVar17));
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xf0 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + 0x60 + lVar17));
        auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x100 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + 0x70 + lVar17));
        auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x110 + lVar17),auVar37,
                                  *(undefined1 (*) [16])(uVar16 + 0x80 + lVar17));
        uVar5 = *(undefined4 *)(ray + k * 4);
        auVar38._4_4_ = uVar5;
        auVar38._0_4_ = uVar5;
        auVar38._8_4_ = uVar5;
        auVar38._12_4_ = uVar5;
        auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar57._4_4_ = uVar5;
        auVar57._0_4_ = uVar5;
        auVar57._8_4_ = uVar5;
        auVar57._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar58._4_4_ = uVar5;
        auVar58._0_4_ = uVar5;
        auVar58._8_4_ = uVar5;
        auVar58._12_4_ = uVar5;
        fVar6 = *(float *)(ray + k * 4 + 0x60);
        auVar61._4_4_ = fVar6;
        auVar61._0_4_ = fVar6;
        auVar61._8_4_ = fVar6;
        auVar61._12_4_ = fVar6;
        auVar50 = vsubps_avx(auVar50,auVar38);
        auVar30 = vsubps_avx512vl(auVar49,auVar28);
        auVar31 = vsubps_avx512vl(auVar44,auVar29);
        auVar32 = vsubps_avx512vl(auVar32,auVar38);
        auVar33 = vsubps_avx512vl(auVar33,auVar28);
        auVar34 = vsubps_avx512vl(auVar34,auVar29);
        auVar35 = vsubps_avx512vl(auVar35,auVar38);
        auVar36 = vsubps_avx512vl(auVar36,auVar28);
        auVar37 = vsubps_avx512vl(auVar37,auVar29);
        auVar28 = vsubps_avx512vl(auVar35,auVar50);
        auVar29 = vsubps_avx512vl(auVar36,auVar30);
        auVar49 = vsubps_avx(auVar37,auVar31);
        auVar38 = vsubps_avx512vl(auVar50,auVar32);
        auVar39 = vsubps_avx512vl(auVar30,auVar33);
        auVar40 = vsubps_avx512vl(auVar31,auVar34);
        auVar41 = vsubps_avx512vl(auVar32,auVar35);
        auVar42 = vsubps_avx512vl(auVar33,auVar36);
        auVar43 = vsubps_avx512vl(auVar34,auVar37);
        auVar44 = vaddps_avx512vl(auVar35,auVar50);
        auVar45 = vaddps_avx512vl(auVar36,auVar30);
        auVar46 = vaddps_avx512vl(auVar37,auVar31);
        auVar47 = vmulps_avx512vl(auVar45,auVar49);
        auVar47 = vfmsub231ps_avx512vl(auVar47,auVar29,auVar46);
        auVar46 = vmulps_avx512vl(auVar46,auVar28);
        auVar46 = vfmsub231ps_avx512vl(auVar46,auVar49,auVar44);
        auVar48._0_4_ = auVar29._0_4_ * auVar44._0_4_;
        auVar48._4_4_ = auVar29._4_4_ * auVar44._4_4_;
        auVar48._8_4_ = auVar29._8_4_ * auVar44._8_4_;
        auVar48._12_4_ = auVar29._12_4_ * auVar44._12_4_;
        auVar44 = vfmsub231ps_fma(auVar48,auVar28,auVar45);
        auVar45._0_4_ = fVar6 * auVar44._0_4_;
        auVar45._4_4_ = fVar6 * auVar44._4_4_;
        auVar45._8_4_ = fVar6 * auVar44._8_4_;
        auVar45._12_4_ = fVar6 * auVar44._12_4_;
        auVar44 = vfmadd231ps_avx512vl(auVar45,auVar58,auVar46);
        auVar45 = vfmadd231ps_avx512vl(auVar44,auVar57,auVar47);
        auVar44 = vaddps_avx512vl(auVar50,auVar32);
        auVar46 = vaddps_avx512vl(auVar30,auVar33);
        auVar47 = vaddps_avx512vl(auVar31,auVar34);
        auVar48 = vmulps_avx512vl(auVar46,auVar40);
        auVar48 = vfmsub231ps_avx512vl(auVar48,auVar39,auVar47);
        auVar47 = vmulps_avx512vl(auVar47,auVar38);
        auVar47 = vfmsub231ps_avx512vl(auVar47,auVar40,auVar44);
        auVar44 = vmulps_avx512vl(auVar44,auVar39);
        auVar44 = vfmsub231ps_avx512vl(auVar44,auVar38,auVar46);
        auVar46._0_4_ = fVar6 * auVar44._0_4_;
        auVar46._4_4_ = fVar6 * auVar44._4_4_;
        auVar46._8_4_ = fVar6 * auVar44._8_4_;
        auVar46._12_4_ = fVar6 * auVar44._12_4_;
        auVar44 = vfmadd231ps_avx512vl(auVar46,auVar58,auVar47);
        auVar46 = vfmadd231ps_avx512vl(auVar44,auVar57,auVar48);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar44 = vaddps_avx512vl(auVar32,auVar35);
        auVar32 = vaddps_avx512vl(auVar33,auVar36);
        auVar33 = vaddps_avx512vl(auVar34,auVar37);
        auVar34 = vmulps_avx512vl(auVar32,auVar43);
        auVar34 = vfmsub231ps_avx512vl(auVar34,auVar42,auVar33);
        auVar35._0_4_ = auVar33._0_4_ * auVar41._0_4_;
        auVar35._4_4_ = auVar33._4_4_ * auVar41._4_4_;
        auVar35._8_4_ = auVar33._8_4_ * auVar41._8_4_;
        auVar35._12_4_ = auVar33._12_4_ * auVar41._12_4_;
        auVar33 = vfmsub231ps_avx512vl(auVar35,auVar43,auVar44);
        auVar44 = vmulps_avx512vl(auVar44,auVar42);
        auVar44 = vfmsub231ps_avx512vl(auVar44,auVar41,auVar32);
        auVar44 = vmulps_avx512vl(auVar44,auVar61);
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar58,auVar33);
        auVar33 = vfmadd231ps_avx512vl(auVar44,auVar57,auVar34);
        auVar34._0_4_ = auVar45._0_4_ + auVar46._0_4_;
        auVar34._4_4_ = auVar45._4_4_ + auVar46._4_4_;
        auVar34._8_4_ = auVar45._8_4_ + auVar46._8_4_;
        auVar34._12_4_ = auVar45._12_4_ + auVar46._12_4_;
        auVar34 = vaddps_avx512vl(auVar33,auVar34);
        auVar35 = vandps_avx512vl(auVar34,auVar47);
        auVar44._8_4_ = 0x34000000;
        auVar44._0_8_ = 0x3400000034000000;
        auVar44._12_4_ = 0x34000000;
        auVar44 = vmulps_avx512vl(auVar35,auVar44);
        auVar32 = vminps_avx512vl(auVar45,auVar46);
        auVar36 = vminps_avx512vl(auVar32,auVar33);
        auVar32._8_4_ = 0x80000000;
        auVar32._0_8_ = 0x8000000080000000;
        auVar32._12_4_ = 0x80000000;
        auVar32 = vxorps_avx512vl(auVar44,auVar32);
        uVar11 = vcmpps_avx512vl(auVar36,auVar32,5);
        auVar32 = vmaxps_avx512vl(auVar45,auVar46);
        auVar32 = vmaxps_avx512vl(auVar32,auVar33);
        uVar12 = vcmpps_avx512vl(auVar32,auVar44,2);
        bVar15 = ((byte)uVar11 | (byte)uVar12) & 0xf;
        if (bVar15 != 0) {
          auVar44 = vmulps_avx512vl(auVar39,auVar49);
          auVar32 = vmulps_avx512vl(auVar28,auVar40);
          auVar33 = vmulps_avx512vl(auVar38,auVar29);
          auVar36 = vmulps_avx512vl(auVar42,auVar40);
          auVar37 = vmulps_avx512vl(auVar38,auVar43);
          auVar48 = vmulps_avx512vl(auVar41,auVar39);
          auVar29 = vfmsub213ps_avx512vl(auVar29,auVar40,auVar44);
          auVar49 = vfmsub213ps_avx512vl(auVar49,auVar38,auVar32);
          auVar28 = vfmsub213ps_avx512vl(auVar28,auVar39,auVar33);
          auVar39 = vfmsub213ps_avx512vl(auVar43,auVar39,auVar36);
          auVar40 = vfmsub213ps_avx512vl(auVar41,auVar40,auVar37);
          auVar38 = vfmsub213ps_avx512vl(auVar42,auVar38,auVar48);
          auVar44 = vandps_avx512vl(auVar44,auVar47);
          auVar36 = vandps_avx512vl(auVar36,auVar47);
          uVar19 = vcmpps_avx512vl(auVar44,auVar36,1);
          auVar44 = vandps_avx512vl(auVar32,auVar47);
          auVar32 = vandps_avx512vl(auVar37,auVar47);
          uVar27 = vcmpps_avx512vl(auVar44,auVar32,1);
          auVar44 = vandps_avx512vl(auVar33,auVar47);
          auVar32 = vandps_avx512vl(auVar48,auVar47);
          uVar10 = vcmpps_avx512vl(auVar44,auVar32,1);
          bVar25 = (bool)((byte)uVar19 & 1);
          local_13f8._0_4_ = (uint)bVar25 * auVar29._0_4_ | (uint)!bVar25 * auVar39._0_4_;
          bVar25 = (bool)((byte)(uVar19 >> 1) & 1);
          local_13f8._4_4_ = (uint)bVar25 * auVar29._4_4_ | (uint)!bVar25 * auVar39._4_4_;
          bVar25 = (bool)((byte)(uVar19 >> 2) & 1);
          local_13f8._8_4_ = (uint)bVar25 * auVar29._8_4_ | (uint)!bVar25 * auVar39._8_4_;
          bVar25 = (bool)((byte)(uVar19 >> 3) & 1);
          local_13f8._12_4_ = (uint)bVar25 * auVar29._12_4_ | (uint)!bVar25 * auVar39._12_4_;
          bVar25 = (bool)((byte)uVar27 & 1);
          local_13e8._0_4_ = (uint)bVar25 * auVar49._0_4_ | (uint)!bVar25 * auVar40._0_4_;
          bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
          local_13e8._4_4_ = (uint)bVar25 * auVar49._4_4_ | (uint)!bVar25 * auVar40._4_4_;
          bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
          local_13e8._8_4_ = (uint)bVar25 * auVar49._8_4_ | (uint)!bVar25 * auVar40._8_4_;
          bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
          local_13e8._12_4_ = (uint)bVar25 * auVar49._12_4_ | (uint)!bVar25 * auVar40._12_4_;
          bVar25 = (bool)((byte)uVar10 & 1);
          local_13d8._0_4_ = (float)((uint)bVar25 * auVar28._0_4_ | (uint)!bVar25 * auVar38._0_4_);
          bVar25 = (bool)((byte)(uVar10 >> 1) & 1);
          local_13d8._4_4_ = (float)((uint)bVar25 * auVar28._4_4_ | (uint)!bVar25 * auVar38._4_4_);
          bVar25 = (bool)((byte)(uVar10 >> 2) & 1);
          local_13d8._8_4_ = (float)((uint)bVar25 * auVar28._8_4_ | (uint)!bVar25 * auVar38._8_4_);
          bVar25 = (bool)((byte)(uVar10 >> 3) & 1);
          local_13d8._12_4_ =
               (float)((uint)bVar25 * auVar28._12_4_ | (uint)!bVar25 * auVar38._12_4_);
          auVar29._0_4_ = fVar6 * local_13d8._0_4_;
          auVar29._4_4_ = fVar6 * local_13d8._4_4_;
          auVar29._8_4_ = fVar6 * local_13d8._8_4_;
          auVar29._12_4_ = fVar6 * local_13d8._12_4_;
          auVar49 = vfmadd213ps_fma(auVar58,local_13e8,auVar29);
          auVar49 = vfmadd213ps_fma(auVar57,local_13f8,auVar49);
          auVar33._0_4_ = auVar49._0_4_ + auVar49._0_4_;
          auVar33._4_4_ = auVar49._4_4_ + auVar49._4_4_;
          auVar33._8_4_ = auVar49._8_4_ + auVar49._8_4_;
          auVar33._12_4_ = auVar49._12_4_ + auVar49._12_4_;
          auVar36._0_4_ = auVar31._0_4_ * local_13d8._0_4_;
          auVar36._4_4_ = auVar31._4_4_ * local_13d8._4_4_;
          auVar36._8_4_ = auVar31._8_4_ * local_13d8._8_4_;
          auVar36._12_4_ = auVar31._12_4_ * local_13d8._12_4_;
          auVar49 = vfmadd213ps_fma(auVar30,local_13e8,auVar36);
          auVar49 = vfmadd213ps_fma(auVar50,local_13f8,auVar49);
          auVar44 = vrcp14ps_avx512vl(auVar33);
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          auVar50 = vfnmadd213ps_avx512vl(auVar44,auVar33,auVar50);
          auVar50 = vfmadd132ps_fma(auVar50,auVar44,auVar44);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar28._4_4_ = uVar5;
          auVar28._0_4_ = uVar5;
          auVar28._8_4_ = uVar5;
          auVar28._12_4_ = uVar5;
          auVar59 = ZEXT1664(auVar28);
          local_1408._0_4_ = auVar50._0_4_ * (auVar49._0_4_ + auVar49._0_4_);
          local_1408._4_4_ = auVar50._4_4_ * (auVar49._4_4_ + auVar49._4_4_);
          local_1408._8_4_ = auVar50._8_4_ * (auVar49._8_4_ + auVar49._8_4_);
          local_1408._12_4_ = auVar50._12_4_ * (auVar49._12_4_ + auVar49._12_4_);
          uVar11 = vcmpps_avx512vl(local_1408,auVar28,2);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar49._4_4_ = uVar5;
          auVar49._0_4_ = uVar5;
          auVar49._8_4_ = uVar5;
          auVar49._12_4_ = uVar5;
          uVar12 = vcmpps_avx512vl(local_1408,auVar49,0xd);
          bVar15 = (byte)uVar11 & (byte)uVar12 & bVar15;
          if (bVar15 != 0) {
            uVar11 = vcmpps_avx512vl(auVar33,_DAT_01f7aa10,4);
            bVar15 = bVar15 & (byte)uVar11;
            if (bVar15 != 0) {
              auVar30._8_4_ = 0x219392ef;
              auVar30._0_8_ = 0x219392ef219392ef;
              auVar30._12_4_ = 0x219392ef;
              uVar19 = vcmpps_avx512vl(auVar35,auVar30,5);
              auVar49 = vrcp14ps_avx512vl(auVar34);
              auVar40._8_4_ = 0x3f800000;
              auVar40._0_8_ = 0x3f8000003f800000;
              auVar40._12_4_ = 0x3f800000;
              auVar50 = vfnmadd213ps_fma(auVar34,auVar49,auVar40);
              auVar50 = vfmadd132ps_avx512vl(auVar50,auVar49,auVar49);
              fVar1 = (float)((uint)((byte)uVar19 & 1) * auVar50._0_4_);
              fVar2 = (float)((uint)((byte)(uVar19 >> 1) & 1) * auVar50._4_4_);
              fVar3 = (float)((uint)((byte)(uVar19 >> 2) & 1) * auVar50._8_4_);
              fVar6 = (float)((uint)((byte)(uVar19 >> 3) & 1) * auVar50._12_4_);
              local_14c8 = context->scene;
              auVar31._0_4_ = fVar1 * auVar45._0_4_;
              auVar31._4_4_ = fVar2 * auVar45._4_4_;
              auVar31._8_4_ = fVar3 * auVar45._8_4_;
              auVar31._12_4_ = fVar6 * auVar45._12_4_;
              local_1428 = vminps_avx(auVar31,auVar40);
              auVar39._0_4_ = fVar1 * auVar46._0_4_;
              auVar39._4_4_ = fVar2 * auVar46._4_4_;
              auVar39._8_4_ = fVar3 * auVar46._8_4_;
              auVar39._12_4_ = fVar6 * auVar46._12_4_;
              local_1418 = vminps_avx(auVar39,auVar40);
              local_14d8 = (ulong)bVar15;
              do {
                uVar19 = 0;
                for (uVar27 = local_14d8; (uVar27 & 1) == 0;
                    uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                  uVar19 = uVar19 + 1;
                }
                pGVar8 = (local_14c8->geometries).items
                         [*(uint *)(lVar17 + uVar16 + 0x120 + uVar19 * 4)].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_14d8 = local_14d8 ^ 1L << (uVar19 & 0x3f);
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00790d66:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar26;
                  }
                  uVar27 = (ulong)(uint)((int)uVar19 * 4);
                  uVar5 = *(undefined4 *)(local_1428 + uVar27);
                  local_12d8._4_4_ = uVar5;
                  local_12d8._0_4_ = uVar5;
                  local_12d8._8_4_ = uVar5;
                  local_12d8._12_4_ = uVar5;
                  uVar5 = *(undefined4 *)(local_1418 + uVar27);
                  local_12c8._4_4_ = uVar5;
                  local_12c8._0_4_ = uVar5;
                  local_12c8._8_4_ = uVar5;
                  local_12c8._12_4_ = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar27);
                  args.context = context->user;
                  local_12a8 = vpbroadcastd_avx512vl();
                  uVar5 = *(undefined4 *)(lVar17 + uVar16 + 0x130 + uVar27);
                  local_12b8._4_4_ = uVar5;
                  local_12b8._0_4_ = uVar5;
                  local_12b8._8_4_ = uVar5;
                  local_12b8._12_4_ = uVar5;
                  uVar5 = *(undefined4 *)(local_13f8 + uVar27);
                  uVar7 = *(undefined4 *)(local_13e8 + uVar27);
                  local_12f8._4_4_ = uVar7;
                  local_12f8._0_4_ = uVar7;
                  local_12f8._8_4_ = uVar7;
                  local_12f8._12_4_ = uVar7;
                  uVar7 = *(undefined4 *)(local_13d8 + uVar27);
                  local_12e8._4_4_ = uVar7;
                  local_12e8._0_4_ = uVar7;
                  local_12e8._8_4_ = uVar7;
                  local_12e8._12_4_ = uVar7;
                  local_1308[0] = (RTCHitN)(char)uVar5;
                  local_1308[1] = (RTCHitN)(char)((uint)uVar5 >> 8);
                  local_1308[2] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                  local_1308[3] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                  local_1308[4] = (RTCHitN)(char)uVar5;
                  local_1308[5] = (RTCHitN)(char)((uint)uVar5 >> 8);
                  local_1308[6] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                  local_1308[7] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                  local_1308[8] = (RTCHitN)(char)uVar5;
                  local_1308[9] = (RTCHitN)(char)((uint)uVar5 >> 8);
                  local_1308[10] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                  local_1308[0xb] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                  local_1308[0xc] = (RTCHitN)(char)uVar5;
                  local_1308[0xd] = (RTCHitN)(char)((uint)uVar5 >> 8);
                  local_1308[0xe] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                  local_1308[0xf] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                  vpcmpeqd_avx2(ZEXT1632(local_12a8),ZEXT1632(local_12a8));
                  uStack_1294 = (args.context)->instID[0];
                  local_1298 = uStack_1294;
                  uStack_1290 = uStack_1294;
                  uStack_128c = uStack_1294;
                  uStack_1288 = (args.context)->instPrimID[0];
                  uStack_1284 = uStack_1288;
                  uStack_1280 = uStack_1288;
                  uStack_127c = uStack_1288;
                  args.valid = (int *)local_14e8;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.hit = local_1308;
                  args.N = 4;
                  local_1328 = auVar62._0_32_;
                  local_1348 = auVar63._0_32_;
                  local_1368 = auVar64._0_32_;
                  local_1388 = auVar65._0_32_;
                  local_13a8 = auVar66._0_32_;
                  local_13c8 = auVar67._0_32_;
                  local_14b8 = auVar59._0_16_;
                  local_14e8 = auVar14;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&args);
                    auVar59 = ZEXT1664(local_14b8);
                    auVar67 = ZEXT3264(local_13c8);
                    auVar66 = ZEXT3264(local_13a8);
                    auVar65 = ZEXT3264(local_1388);
                    auVar64 = ZEXT3264(local_1368);
                    auVar63 = ZEXT3264(local_1348);
                    auVar62 = ZEXT3264(local_1328);
                  }
                  uVar27 = vptestmd_avx512vl(local_14e8,local_14e8);
                  if ((uVar27 & 0xf) != 0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&args);
                      auVar59 = ZEXT1664(local_14b8);
                      auVar67 = ZEXT3264(local_13c8);
                      auVar66 = ZEXT3264(local_13a8);
                      auVar65 = ZEXT3264(local_1388);
                      auVar64 = ZEXT3264(local_1368);
                      auVar63 = ZEXT3264(local_1348);
                      auVar62 = ZEXT3264(local_1328);
                    }
                    auVar50 = *(undefined1 (*) [16])(args.ray + 0x80);
                    uVar27 = vptestmd_avx512vl(local_14e8,local_14e8);
                    uVar27 = uVar27 & 0xf;
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar25 = (bool)((byte)uVar27 & 1);
                    auVar41._0_4_ = (uint)bVar25 * auVar49._0_4_ | (uint)!bVar25 * auVar50._0_4_;
                    bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
                    auVar41._4_4_ = (uint)bVar25 * auVar49._4_4_ | (uint)!bVar25 * auVar50._4_4_;
                    bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
                    auVar41._8_4_ = (uint)bVar25 * auVar49._8_4_ | (uint)!bVar25 * auVar50._8_4_;
                    bVar25 = SUB81(uVar27 >> 3,0);
                    auVar41._12_4_ = (uint)bVar25 * auVar49._12_4_ | (uint)!bVar25 * auVar50._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar41;
                    if ((byte)uVar27 != 0) goto LAB_00790d66;
                  }
                  *(int *)(ray + k * 4 + 0x80) = auVar59._0_4_;
                  local_14d8 = local_14d8 ^ 1L << (uVar19 & 0x3f);
                }
              } while (local_14d8 != 0);
            }
          }
        }
        local_14d0 = local_14d0 + 1;
        auVar59 = ZEXT3264(local_1258);
        auVar60 = ZEXT3264(local_1278);
      } while (local_14d0 != local_14c0);
    }
LAB_00790d50:
    bVar26 = pNVar21 != stack;
    if (!bVar26) {
      return bVar26;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }